

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

void luaF_closeupval(lua_State *L,StkId level)

{
  byte bVar1;
  UpVal *o;
  UpVal *pUVar2;
  TValue *pTVar3;
  TValue *io1;
  
  o = L->openupval;
  while ((o != (UpVal *)0x0 && (level <= (StkId)(o->v).p))) {
    pUVar2 = (o->u).open.next;
    **(long **)((long)&o->u + 8) = (long)pUVar2;
    if (pUVar2 != (UpVal *)0x0) {
      (pUVar2->u).open.previous = *(UpVal ***)((long)&o->u + 8);
    }
    pTVar3 = (o->v).p;
    pUVar2 = (UpVal *)(pTVar3->value_).gc;
    (o->u).open.next = pUVar2;
    bVar1 = pTVar3->tt_;
    *(byte *)((long)&o->u + 8) = bVar1;
    (o->v).p = (TValue *)&o->u;
    if ((((o->marked & 0x18) == 0) && (o->marked = o->marked | 0x20, (bVar1 & 0x40) != 0)) &&
       ((pUVar2->marked & 0x18) != 0)) {
      luaC_barrier_(L,(GCObject *)o,(GCObject *)pUVar2);
    }
    o = L->openupval;
  }
  return;
}

Assistant:

void luaF_closeupval (lua_State *L, StkId level) {
  UpVal *uv;
  StkId upl;  /* stack index pointed by 'uv' */
  while ((uv = L->openupval) != NULL && (upl = uplevel(uv)) >= level) {
    TValue *slot = &uv->u.value;  /* new position for value */
    lua_assert(uplevel(uv) < L->top.p);
    luaF_unlinkupval(uv);  /* remove upvalue from 'openupval' list */
    setobj(L, slot, uv->v.p);  /* move value to upvalue slot */
    uv->v.p = slot;  /* now current value lives here */
    if (!iswhite(uv)) {  /* neither white nor dead? */
      nw2black(uv);  /* closed upvalues cannot be gray */
      luaC_barrier(L, uv, slot);
    }
  }
}